

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsCoreDisconnect(HelicsCore core,HelicsError *err)

{
  element_type *peVar1;
  CoreObject *pCVar2;
  
  pCVar2 = helics::getCoreObject(core,err);
  if ((pCVar2 != (CoreObject *)0x0) &&
     (peVar1 = (pCVar2->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , peVar1 != (element_type *)0x0)) {
    (*peVar1->_vptr_Core[8])();
  }
  return;
}

Assistant:

void helicsCoreDisconnect(HelicsCore core, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }

    try {
        cppcore->disconnect();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}